

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialVector * __thiscall
RigidBodyDynamics::Math::SpatialTransform::applyTranspose
          (SpatialTransform *this,SpatialVector *f_sp)

{
  double dVar1;
  Scalar *pSVar2;
  CoeffReturnType pdVar3;
  SpatialVector *in_RDI;
  Vector3_t *this_00;
  double *v0;
  Vector3d E_T_f;
  Index in_stack_fffffffffffffe18;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffffe20;
  double *pdVar4;
  double *v1;
  double *v0_00;
  double *v4;
  double *v3;
  double *v2;
  double *v1_00;
  SpatialVector_t *this_01;
  
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b6c8e);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b6cca);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b6d20);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,0x6b6d73);
  pdVar4 = (double *)*pSVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  v1 = (double *)*pdVar3;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,0x6b6dae);
  dVar1 = *pSVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  this_00 = (Vector3_t *)((double)pdVar4 * (double)v1 + dVar1 * *pdVar3);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,0x6b6e05);
  v0_00 = (double *)*pSVar2;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,0x6b6e58);
  v3 = (double *)*pSVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  v2 = (double *)*pdVar3;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,0x6b6e95);
  v4 = (double *)*pSVar2;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  v0 = (double *)((double)v3 * (double)v2 + (double)v4 * *pdVar3);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,0x6b6eed);
  v1_00 = (double *)*pSVar2;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Vector3_t::Vector3_t(this_00,v0_00,v1,pdVar4);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b6f66);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  pdVar4 = (double *)*pdVar3;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,0x6b6fa7);
  this_01 = (SpatialVector_t *)*pSVar2;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b700c);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b7137);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b7177);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b71dd);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b7306);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b7348);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,0x6b73ac);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  SpatialVector_t::SpatialVector_t(this_01,v0,v1_00,v2,v3,v4,pdVar4);
  return in_RDI;
}

Assistant:

SpatialVector applyTranspose (const SpatialVector &f_sp) {
    Vector3d E_T_f (
        E(0,0) * f_sp[3] + E(1,0) * f_sp[4] + E(2,0) * f_sp[5],
        E(0,1) * f_sp[3] + E(1,1) * f_sp[4] + E(2,1) * f_sp[5],
        E(0,2) * f_sp[3] + E(1,2) * f_sp[4] + E(2,2) * f_sp[5]
        );

    return SpatialVector (
        E(0,0) * f_sp[0] + E(1,0) * f_sp[1] + E(2,0) * f_sp[2] - r[2] * E_T_f[1] + r[1] * E_T_f[2],
        E(0,1) * f_sp[0] + E(1,1) * f_sp[1] + E(2,1) * f_sp[2] + r[2] * E_T_f[0] - r[0] * E_T_f[2],
        E(0,2) * f_sp[0] + E(1,2) * f_sp[1] + E(2,2) * f_sp[2] - r[1] * E_T_f[0] + r[0] * E_T_f[1],
        E_T_f [0],
        E_T_f [1],
        E_T_f [2]
        );
  }